

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

size_t zt_cstr_chr(char *s,ssize_t i,ssize_t j,int c)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    sVar3 = 0;
    sVar2 = 0;
  }
  else {
    sVar4 = (i >> 0x3f & sVar1) + i;
    if ((long)sVar1 <= (long)sVar4) {
      sVar4 = sVar1 - 1;
    }
    sVar2 = (j >> 0x3f & sVar1) + j;
    if ((long)sVar1 <= (long)sVar2) {
      sVar2 = sVar1 - 1;
    }
    sVar3 = sVar2;
    if ((long)sVar2 < (long)sVar4) {
      sVar3 = sVar4;
    }
    if ((long)sVar4 < (long)sVar2) {
      sVar2 = sVar4;
    }
  }
  while( true ) {
    if ((long)sVar3 < (long)sVar2) {
      return 0;
    }
    if (s[sVar2] == c) break;
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

size_t
zt_cstr_chr(const char *s, ssize_t i, ssize_t j, int c) {
    zt_assert(s);

    CONVERT(s, i, j);
    for (; i <= j; i++) {
        if (s[i] == c) {
            return (size_t)i;
        }
    }

    return 0;
}